

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDuplicateEdgeWithMultipleOutputsError::~ParserTestDuplicateEdgeWithMultipleOutputsError
          (ParserTestDuplicateEdgeWithMultipleOutputsError *this)

{
  ParserTestDuplicateEdgeWithMultipleOutputsError *this_local;
  
  ~ParserTestDuplicateEdgeWithMultipleOutputsError(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateEdgeWithMultipleOutputsError) {
  const char kInput[] =
"rule cat\n"
"  command = cat $in > $out\n"
"build out1 out2: cat in1\n"
"build out1: cat in2\n"
"build final: cat out1\n";
  ManifestParserOptions parser_opts;
  parser_opts.dupe_edge_action_ = kDupeEdgeActionError;
  ManifestParser parser(&state, &fs_, parser_opts);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:5: multiple rules generate out1\n", err);
}